

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O2

void __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,FieldBegin fb)

{
  OstreamBuffer *this_00;
  size_t in_RCX;
  
  comma(this);
  if (fb.name._len != 0) {
    this_00 = this->_out;
    detail::OstreamBuffer::write(this_00,(int)fb.name._ptr,(void *)fb.name._len,in_RCX);
    detail::OstreamBuffer::operator<<(this_00,": ");
  }
  this->_state = Normal;
  return;
}

Assistant:

void ToStringVisitor::visit(mserialize::Visitor::FieldBegin fb)
{
  comma();
  if (! fb.name.empty())
  {
    _out << fb.name << ": ";
  }
  _state = State::Normal;
}